

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

void fill_derived_format_values(FMContext fmc,FMFormat_conflict format)

{
  FMFieldList p_Var1;
  int iVar2;
  FMdata_type FVar3;
  char *str;
  FMTypeDesc *pFVar4;
  FMFormat_conflict p_Var5;
  uint uVar6;
  long lVar7;
  FMFormat_conflict *pp_Var8;
  int *piVar9;
  long elements;
  long local_38;
  
  format->context = fmc;
  format->variant = 0;
  format->recursive = 0;
  p_Var1 = format->field_list;
  if (0 < format->field_count) {
    piVar9 = &p_Var1->field_size;
    lVar7 = 0;
    do {
      iVar2 = is_all_static_array_dimens(*(char **)(piVar9 + -2));
      if (iVar2 != 0) {
        local_38 = 1;
        FVar3 = FMarray_str_to_data_type(*(char **)(piVar9 + -2),&local_38);
        if ((FVar3 != unknown_type) && (0x10 < *piVar9)) {
          fprintf(_stderr,
                  "Field size for field %s in format %s is large, check to see if it is valid.\n",
                  ((_FMField *)(piVar9 + -4))->field_name);
        }
      }
      lVar7 = lVar7 + 1;
      piVar9 = piVar9 + 6;
    } while (lVar7 < format->field_count);
  }
  generate_var_list(format,format->subformats);
  if (0 < format->field_count) {
    lVar7 = 0;
    do {
      if (format->var_list[lVar7].string == 1) {
        format->variant = 1;
      }
      else {
        str = base_data_type(p_Var1[lVar7].field_type);
        FVar3 = FMstr_to_data_type(str);
        if (FVar3 == unknown_type) {
          pp_Var8 = format->subformats;
          if (pp_Var8 != (FMFormat_conflict *)0x0) {
            p_Var5 = *pp_Var8;
            while (p_Var5 != (FMFormat_conflict)0x0) {
              pp_Var8 = pp_Var8 + 1;
              iVar2 = strcmp(str,p_Var5->format_name);
              if (iVar2 == 0) {
                format->field_subformats[lVar7] = p_Var5;
              }
              p_Var5 = *pp_Var8;
            }
          }
          p_Var5 = format->field_subformats[lVar7];
        }
        else {
          p_Var5 = (FMFormat_conflict)0x0;
        }
        uVar6 = 1;
        if (format->var_list[lVar7].var_array == 1) {
LAB_0011eabe:
          format->variant = uVar6;
        }
        else if (p_Var5 != (FMFormat_conflict)0x0) {
          uVar6 = format->variant | p_Var5->variant;
          goto LAB_0011eabe;
        }
        pFVar4 = &format->var_list[lVar7].type_desc;
        do {
          if (pFVar4->type == FMType_pointer) {
            format->variant = 1;
          }
          pFVar4 = pFVar4->next;
        } while (pFVar4 != (FMTypeDesc *)0x0);
        free(str);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < format->field_count);
  }
  return;
}

Assistant:

static void
fill_derived_format_values(FMContext fmc, FMFormat format)
{
    FMFieldList field_list;
    int field;
    format->context = fmc;
    format->variant = 0;
    format->recursive = 0;
    field_list = format->field_list;
    for (field = 0; field < format->field_count; field++) {
	int field_size = 0;
	if (is_var_array_field(field_list, field) == 1) {
	    /* variant array, real_field_size is format->pointer_size */
	    field_size = format->pointer_size;
	} else {
	    long elements = 1;
	    FMdata_type base_type;
	    base_type = FMarray_str_to_data_type(field_list[field].field_type,
					       &elements);
	    if ((base_type != unknown_type) &&
		(field_list[field].field_size > 16)) {
		fprintf(stderr, "Field size for field %s in format %s is large, check to see if it is valid.\n",
			field_list[field].field_name, format->format_name);
	    }
	    field_size = field_list[field].field_size * elements;
	}
	(void) field_size;
    }
    generate_var_list(format, format->subformats);
    for (field = 0; field < format->field_count; field++) {
	if (format->var_list[field].string == 1) {
	    format->variant = 1;
	} else {
	    char *base_type =
		base_data_type(field_list[field].field_type);
	    FMFormat subformat = NULL;
	    FMTypeDesc* desc = NULL;

	    /* if field is of another record format, fill that in */
	    if (FMstr_to_data_type(base_type) == unknown_type) {
	        FMFormat *subformats = format->subformats;
		while (subformats && subformats[0]) {
		    if (strcmp(base_type, subformats[0]->format_name) == 0) {
		    
		        format->field_subformats[field] = subformats[0];
		    }
		    subformats++;
		}
		subformat = format->field_subformats[field];
	    }
	    if (format->var_list[field].var_array == 1) {
		/* got a variant array */
		format->variant = 1;
	    } else {
		/* if field is variant by its subformat being variant */
		if (subformat != NULL) {
		    format->variant |= subformat->variant;
		}
	    }
	    desc = &format->var_list[field].type_desc;
	    while (desc != NULL) {
		if (desc->type == FMType_pointer) format->variant = 1;
		desc = desc->next;
	    }
	    free(base_type);
	}
    }
}